

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCLoader.cpp
# Opt level: O3

void anon_unknown.dwarf_d8f3db::ResolveObjectPlacement
               (aiMatrix4x4 *m,IfcObjectPlacement *place,ConversionData *conv)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  long lVar17;
  IfcObjectPlacement *place_00;
  long *plVar18;
  long *plVar19;
  _func_int *p_Var20;
  aiMatrix4x4 tmp_1;
  IfcMatrix4 tmp;
  allocator<char> local_209;
  long *local_208 [2];
  long local_1f8 [2];
  undefined1 local_1e8 [32];
  undefined8 uStack_1c8;
  float local_1c0;
  undefined8 uStack_1bc;
  undefined8 uStack_1b4;
  float fStack_1ac;
  undefined1 local_198 [8];
  double dStack_190;
  double dStack_188;
  double dStack_180;
  double dStack_178;
  double local_170;
  double local_168;
  double dStack_160;
  double local_158;
  double dStack_150;
  double local_148;
  double dStack_140;
  double dStack_138;
  double dStack_130;
  double dStack_128;
  double local_120;
  
  p_Var20 = (_func_int *)
            ((long)&(place->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObjectPlacement,_0UL>).
                    _vptr_ObjectHelper +
            (long)(place->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObjectPlacement,_0UL>).
                  _vptr_ObjectHelper[-3]);
  lVar17 = __dynamic_cast(p_Var20,&Assimp::STEP::Object::typeinfo,
                          &Assimp::IFC::Schema_2x3::IfcLocalPlacement::typeinfo,0xffffffffffffffff);
  if (lVar17 == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_208,*(char **)(p_Var20 + 0x10),&local_209);
    plVar18 = (long *)std::__cxx11::string::replace((ulong)local_208,0,(char *)0x0,0x6a74d8);
    plVar19 = plVar18 + 2;
    if ((long *)*plVar18 == plVar19) {
      local_1e8._24_8_ = plVar18[3];
      local_1e8._16_4_ = (undefined4)*plVar19;
      local_1e8._20_4_ = (undefined4)((ulong)*plVar19 >> 0x20);
      local_1e8._0_8_ = local_1e8 + 0x10;
    }
    else {
      local_1e8._16_4_ = (undefined4)*plVar19;
      local_1e8._20_4_ = (undefined4)((ulong)*plVar19 >> 0x20);
      local_1e8._0_8_ = (long *)*plVar18;
    }
    local_1e8._8_4_ = (undefined4)plVar18[1];
    local_1e8._12_4_ = (undefined4)((ulong)plVar18[1] >> 0x20);
    *plVar18 = (long)plVar19;
    plVar18[1] = 0;
    *(undefined1 *)(plVar18 + 2) = 0;
    Assimp::Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
    basic_formatter<std::__cxx11::string>
              ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)local_198,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e8);
    Assimp::LogFunctions<Assimp::IFCImporter>::LogWarn((format *)local_198);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
    std::ios_base::~ios_base((ios_base *)&dStack_128);
    if ((undefined1 *)local_1e8._0_8_ != local_1e8 + 0x10) {
      operator_delete((void *)local_1e8._0_8_,CONCAT44(local_1e8._20_4_,local_1e8._16_4_) + 1);
    }
    if (local_208[0] != local_1f8) {
      operator_delete(local_208[0],local_1f8[0] + 1);
    }
  }
  else {
    local_198 = (undefined1  [8])0x3ff0000000000000;
    dStack_190 = 0.0;
    dStack_188 = 0.0;
    dStack_180 = 0.0;
    dStack_178 = 0.0;
    local_170 = 1.0;
    local_168 = 0.0;
    dStack_160 = 0.0;
    local_158 = 0.0;
    dStack_150 = 0.0;
    local_148 = 1.0;
    dStack_140 = 0.0;
    dStack_138 = 0.0;
    dStack_130 = 0.0;
    dStack_128 = 0.0;
    local_120 = 1.0;
    Assimp::IFC::ConvertAxisPlacement
              ((IfcMatrix4 *)local_198,*(IfcAxis2Placement **)(lVar17 + 0x30),conv);
    m->a1 = (float)(double)local_198;
    m->a2 = (float)dStack_190;
    m->a3 = (float)dStack_188;
    m->a4 = (float)dStack_180;
    m->b1 = (float)dStack_178;
    m->b2 = (float)local_170;
    m->b3 = (float)local_168;
    m->b4 = (float)dStack_160;
    m->c1 = (float)local_158;
    m->c2 = (float)dStack_150;
    m->c3 = (float)local_148;
    m->c4 = (float)dStack_140;
    m->d1 = (float)dStack_138;
    m->d2 = (float)dStack_130;
    m->d3 = (float)dStack_128;
    m->d4 = (float)local_120;
    if (*(char *)(lVar17 + 0x28) == '\x01') {
      local_1e8._0_4_ = 1.0;
      local_1e8._4_4_ = 0.0;
      local_1e8._8_4_ = 0.0;
      local_1e8._12_4_ = 0.0;
      local_1e8._16_4_ = 0.0;
      local_1e8._20_4_ = 1.0;
      local_1e8._24_4_ = 0.0;
      local_1e8._28_4_ = 0.0;
      uStack_1c8._0_4_ = 0.0;
      uStack_1c8._4_4_ = 0.0;
      local_1c0 = 1.0;
      uStack_1bc._0_4_ = 0.0;
      uStack_1bc._4_4_ = 0.0;
      uStack_1b4._0_4_ = 0.0;
      uStack_1b4._4_4_ = 0.0;
      fStack_1ac = 1.0;
      place_00 = Assimp::STEP::LazyObject::To<Assimp::IFC::Schema_2x3::IfcObjectPlacement>
                           (*(LazyObject **)(lVar17 + 0x20));
      ResolveObjectPlacement((aiMatrix4x4 *)local_1e8,place_00,conv);
      fVar1 = m->a1;
      fVar2 = m->a2;
      fVar3 = m->a3;
      fVar4 = m->a4;
      fVar5 = m->b1;
      fVar6 = m->b2;
      fVar7 = m->b3;
      fVar8 = m->b4;
      fVar9 = m->c1;
      fVar10 = m->c2;
      fVar11 = m->c3;
      fVar12 = m->c4;
      fVar13 = m->d1;
      fVar14 = m->d2;
      fVar15 = m->d3;
      fVar16 = m->d4;
      m->a1 = (float)local_1e8._12_4_ * fVar13 +
              (float)local_1e8._8_4_ * fVar9 +
              (float)local_1e8._0_4_ * fVar1 + (float)local_1e8._4_4_ * fVar5;
      m->a2 = (float)local_1e8._12_4_ * fVar14 +
              (float)local_1e8._8_4_ * fVar10 +
              (float)local_1e8._0_4_ * fVar2 + (float)local_1e8._4_4_ * fVar6;
      m->a3 = (float)local_1e8._12_4_ * fVar15 +
              (float)local_1e8._8_4_ * fVar11 +
              (float)local_1e8._0_4_ * fVar3 + (float)local_1e8._4_4_ * fVar7;
      m->a4 = (float)local_1e8._12_4_ * fVar16 +
              (float)local_1e8._8_4_ * fVar12 +
              (float)local_1e8._0_4_ * fVar4 + (float)local_1e8._4_4_ * fVar8;
      m->b1 = (float)local_1e8._28_4_ * fVar13 +
              (float)local_1e8._24_4_ * fVar9 +
              (float)local_1e8._16_4_ * fVar1 + (float)local_1e8._20_4_ * fVar5;
      m->b2 = (float)local_1e8._28_4_ * fVar14 +
              (float)local_1e8._24_4_ * fVar10 +
              (float)local_1e8._16_4_ * fVar2 + (float)local_1e8._20_4_ * fVar6;
      m->b3 = (float)local_1e8._28_4_ * fVar15 +
              (float)local_1e8._24_4_ * fVar11 +
              (float)local_1e8._16_4_ * fVar3 + (float)local_1e8._20_4_ * fVar7;
      m->b4 = (float)local_1e8._28_4_ * fVar16 +
              (float)local_1e8._24_4_ * fVar12 +
              (float)local_1e8._16_4_ * fVar4 + (float)local_1e8._20_4_ * fVar8;
      m->c1 = (float)uStack_1bc * fVar13 +
              local_1c0 * fVar9 + (float)uStack_1c8 * fVar1 + uStack_1c8._4_4_ * fVar5;
      m->c2 = (float)uStack_1bc * fVar14 +
              local_1c0 * fVar10 + (float)uStack_1c8 * fVar2 + uStack_1c8._4_4_ * fVar6;
      m->c3 = (float)uStack_1bc * fVar15 +
              local_1c0 * fVar11 + (float)uStack_1c8 * fVar3 + uStack_1c8._4_4_ * fVar7;
      m->c4 = (float)uStack_1bc * fVar16 +
              local_1c0 * fVar12 + (float)uStack_1c8 * fVar4 + uStack_1c8._4_4_ * fVar8;
      m->d1 = fStack_1ac * fVar13 +
              uStack_1b4._4_4_ * fVar9 + uStack_1bc._4_4_ * fVar1 + (float)uStack_1b4 * fVar5;
      m->d2 = fStack_1ac * fVar14 +
              uStack_1b4._4_4_ * fVar10 + uStack_1bc._4_4_ * fVar2 + (float)uStack_1b4 * fVar6;
      m->d3 = fStack_1ac * fVar15 +
              uStack_1b4._4_4_ * fVar11 + uStack_1bc._4_4_ * fVar3 + (float)uStack_1b4 * fVar7;
      m->d4 = fStack_1ac * fVar16 +
              uStack_1b4._4_4_ * fVar12 + uStack_1bc._4_4_ * fVar4 + (float)uStack_1b4 * fVar8;
    }
  }
  return;
}

Assistant:

void ResolveObjectPlacement(aiMatrix4x4& m, const Schema_2x3::IfcObjectPlacement& place, ConversionData& conv)
{
    if (const Schema_2x3::IfcLocalPlacement* const local = place.ToPtr<Schema_2x3::IfcLocalPlacement>()){
        IfcMatrix4 tmp;
        ConvertAxisPlacement(tmp, *local->RelativePlacement, conv);

        m = static_cast<aiMatrix4x4>(tmp);

        if (local->PlacementRelTo) {
            aiMatrix4x4 tmp;
            ResolveObjectPlacement(tmp,local->PlacementRelTo.Get(),conv);
            m = tmp * m;
        }
    }
    else {
        IFCImporter::LogWarn("skipping unknown IfcObjectPlacement entity, type is " + place.GetClassName());
    }
}